

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImTextStrToUtf8(char *out_buf,int out_buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  char *buf_p;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar2 = (int)out_buf;
  pbVar3 = (byte *)(out_buf + (long)out_buf_size + -1);
  if (out_buf < pbVar3) {
    do {
      if ((in_text_end <= in_text && in_text_end != (ImWchar *)0x0) ||
         (uVar1 = *in_text, uVar1 == 0)) break;
      if (uVar1 < 0x80) {
        *out_buf = (byte)uVar1;
        out_buf = (char *)((byte *)out_buf + 1);
      }
      else {
        iVar5 = ~(uint)out_buf + out_buf_size + iVar2;
        if (uVar1 < 0x800) {
          if (1 < iVar5) {
            *out_buf = (byte)(uVar1 >> 6) | 0xc0;
            lVar4 = 2;
            lVar6 = 1;
            goto LAB_0010d4b8;
          }
LAB_0010d489:
          lVar4 = 0;
        }
        else {
          if (iVar5 < 3) goto LAB_0010d489;
          *out_buf = (byte)(uVar1 >> 0xc) | 0xe0;
          ((byte *)out_buf)[1] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
          lVar4 = 3;
          lVar6 = 2;
LAB_0010d4b8:
          ((byte *)out_buf)[lVar6] = (byte)uVar1 & 0x3f | 0x80;
        }
        out_buf = (char *)((byte *)out_buf + lVar4);
      }
      in_text = in_text + 1;
    } while (out_buf < pbVar3);
  }
  *out_buf = 0;
  return (int)out_buf - iVar2;
}

Assistant:

int ImTextStrToUtf8(char* out_buf, int out_buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_p = out_buf;
    const char* buf_end = out_buf + out_buf_size;
    while (buf_p < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_p++ = (char)c;
        else
            buf_p += ImTextCharToUtf8_inline(buf_p, (int)(buf_end - buf_p - 1), c);
    }
    *buf_p = 0;
    return (int)(buf_p - out_buf);
}